

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void libtorrent::aux::expand_unspecified_address
               (span<const_libtorrent::aux::ip_interface> ifs,
               span<const_libtorrent::aux::ip_route> routes,
               vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
               *eps)

{
  anon_enum_32 aVar1;
  span<const_libtorrent::aux::ip_route> routes_00;
  vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
  *this;
  listen_endpoint_t *plVar2;
  int iVar3;
  listen_endpoint_t *__b;
  size_t sVar4;
  difference_type extraout_RDX;
  pointer plVar5;
  ip_interface *a;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  _Var6;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  __it;
  ip_interface *piVar7;
  long lVar8;
  byte bVar9;
  listen_endpoint_t *plVar10;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  _Var11;
  bool bVar12;
  span<const_libtorrent::aux::ip_route> routes_01;
  string_view device;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  unspecified_eps;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:273:45)>
  local_a0;
  vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
  *local_90;
  ip_route *local_88;
  ip_route *local_80;
  ip_interface *local_78;
  difference_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  transport *local_60;
  int *local_58;
  listen_endpoint_t *local_50;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  local_48;
  
  local_80 = (ip_route *)routes.m_len;
  local_88 = routes.m_ptr;
  local_70 = ifs.m_len;
  local_78 = ifs.m_ptr;
  _Var6._M_current =
       (eps->
       super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
       )._M_impl.super__Vector_impl_data._M_start;
  plVar10 = (eps->
            super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  plVar2 = _Var6._M_current;
  local_90 = (vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
              *)eps;
  if (_Var6._M_current != plVar10) {
    do {
      while (_Var6._M_current = plVar2, ((_Var6._M_current)->addr).type_ != ipv4) {
        if ((((((((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0] == '\0') &&
               (((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[1] == '\0')) &&
              (((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[2] == '\0')) &&
             ((((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[3] == '\0' &&
              (((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[4] == '\0')))) &&
            ((((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[5] == '\0' &&
             ((((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[6] == '\0' &&
              (((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[7] == '\0')))))) &&
           ((((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[8] == '\0' &&
            ((((((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[9] == '\0' &&
               (((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[10] == '\0')) &&
              (((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xb] == '\0')) &&
             (((((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xc] == '\0' &&
               (((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xd] == '\0')) &&
              (((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xe] == '\0')))))))
           ) {
          bVar12 = ((_Var6._M_current)->addr).ipv6_address_.addr_.__in6_u.__u6_addr8[0xf] == '\0';
          goto LAB_002c1131;
        }
LAB_002c1138:
        _Var6._M_current = _Var6._M_current + 1;
        plVar2 = _Var6._M_current;
        if (_Var6._M_current == plVar10) goto LAB_002c1207;
      }
      bVar12 = ((_Var6._M_current)->addr).ipv4_address_.addr_.s_addr == 0;
LAB_002c1131:
      if (!bVar12) goto LAB_002c1138;
      do {
        __b = plVar10 + -1;
        if (__b == _Var6._M_current) goto LAB_002c1207;
        if ((__b->addr).type_ == ipv4) {
          bVar12 = plVar10[-1].addr.ipv4_address_.addr_.s_addr == 0;
        }
        else {
          if ((((plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[0] != '\0') ||
               (plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[1] != '\0')) ||
              ((((plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[2] != '\0' ||
                 (((plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[3] != '\0' ||
                   (plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[4] != '\0')) ||
                  (plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[5] != '\0')))) ||
                ((plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[6] != '\0' ||
                 (plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[7] != '\0')))) ||
               (plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[8] != '\0')))) ||
             (((plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[9] != '\0' ||
               (plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[10] != '\0')) ||
              ((plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[0xb] != '\0' ||
               (((plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[0xc] != '\0' ||
                 (plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[0xd] != '\0')) ||
                (plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[0xe] != '\0')))))))) break;
          bVar12 = plVar10[-1].addr.ipv6_address_.addr_.__in6_u.__u6_addr8[0xf] == '\0';
        }
        plVar10 = __b;
      } while (bVar12);
      ::std::swap<libtorrent::aux::listen_endpoint_t>(_Var6._M_current,__b);
      plVar2 = _Var6._M_current + 1;
      plVar10 = __b;
    } while (__b != _Var6._M_current + 1);
    _Var6._M_current = _Var6._M_current + 1;
  }
LAB_002c1207:
  this = local_90;
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>::
  vector<__gnu_cxx::__normal_iterator<libtorrent::aux::listen_endpoint_t*,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>>,void>
            ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
              *)&local_48,_Var6,*(listen_endpoint_t **)(local_90 + 8),(allocator_type *)&local_a0);
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>::
  _M_erase((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
            *)this,(iterator)_Var6._M_current,*(listen_endpoint_t **)(this + 8));
  local_50 = local_48.
             super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    piVar7 = local_78 + local_70;
    plVar5 = local_48.
             super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_70 != 0) {
        aVar1 = (plVar5->addr).type_;
        local_68 = &plVar5->device;
        local_58 = &plVar5->port;
        local_60 = &plVar5->ssl;
        a = local_78;
        do {
          if (((a->preferred == true) && (((a->interface_address).type_ == ipv4) == (aVar1 == ipv4))
              ) && (((plVar5->device)._M_string_length == 0 ||
                    (iVar3 = ::std::__cxx11::string::compare((char *)local_68), iVar3 == 0)))) {
            _Var6._M_current = *(listen_endpoint_t **)local_90;
            plVar10 = *(listen_endpoint_t **)(local_90 + 8);
            lVar8 = ((long)plVar10 - (long)_Var6._M_current >> 4) * 0x6db6db6db6db6db7 >> 2;
            __it._M_current = _Var6._M_current;
            local_a0._M_pred.ipface = a;
            local_a0._M_pred.uep = plVar5;
            if (0 < lVar8) {
              __it._M_current = _Var6._M_current + lVar8 * 4;
              lVar8 = lVar8 + 1;
              do {
                bVar12 = __gnu_cxx::__ops::
                         _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                         ::operator()(&local_a0,_Var6);
                _Var11._M_current = _Var6._M_current;
                if (bVar12) goto LAB_002c1443;
                bVar12 = __gnu_cxx::__ops::
                         _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                         ::operator()(&local_a0,_Var6._M_current + 1);
                _Var11._M_current = _Var6._M_current + 1;
                if (bVar12) goto LAB_002c1443;
                bVar12 = __gnu_cxx::__ops::
                         _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                         ::operator()(&local_a0,_Var6._M_current + 2);
                _Var11._M_current = _Var6._M_current + 2;
                if (bVar12) goto LAB_002c1443;
                bVar12 = __gnu_cxx::__ops::
                         _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                         ::operator()(&local_a0,_Var6._M_current + 3);
                _Var11._M_current = _Var6._M_current + 3;
                if (bVar12) goto LAB_002c1443;
                _Var6._M_current = _Var6._M_current + 4;
                lVar8 = lVar8 + -1;
              } while (1 < lVar8);
            }
            lVar8 = ((long)plVar10 - (long)__it._M_current >> 4) * 0x6db6db6db6db6db7;
            if (lVar8 == 1) {
LAB_002c142a:
              bVar12 = __gnu_cxx::__ops::
                       _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                       ::operator()(&local_a0,__it);
              _Var11._M_current = __it._M_current;
              if (!bVar12) {
                _Var11._M_current = plVar10;
              }
            }
            else if (lVar8 == 2) {
LAB_002c13fe:
              bVar12 = __gnu_cxx::__ops::
                       _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                       ::operator()(&local_a0,__it);
              _Var11._M_current = __it._M_current;
              if (!bVar12) {
                __it._M_current = __it._M_current + 1;
                goto LAB_002c142a;
              }
            }
            else {
              _Var11._M_current = plVar10;
              if ((lVar8 == 3) &&
                 (bVar12 = __gnu_cxx::__ops::
                           _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                           ::operator()(&local_a0,__it), _Var11._M_current = __it._M_current,
                 !bVar12)) {
                __it._M_current = __it._M_current + 1;
                goto LAB_002c13fe;
              }
            }
LAB_002c1443:
            if ((_Var11._M_current == plVar10) &&
               (((a->state == unknown || (a->state == up)) && (((a->flags).m_val & 1) != 0)))) {
              if ((a->interface_address).type_ == ipv4) {
                bVar12 = (char)(a->interface_address).ipv4_address_.addr_.s_addr == '\x7f';
LAB_002c151d:
                bVar9 = 6;
                if (!bVar12) goto LAB_002c152b;
              }
              else {
                if ((((((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[0] == '\0') &&
                      ((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[1] == '\0')) &&
                     (((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[2] == '\0' &&
                      (((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[3] == '\0' &&
                       ((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[4] == '\0'))))
                     )) && ((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[5] == '\0'
                           )) &&
                   (((((((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[6] == '\0' &&
                        ((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[7] == '\0'))
                       && ((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[8] == '\0')
                       ) && (((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[9] ==
                              '\0' && ((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8
                                       [10] == '\0')))) &&
                     (((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[0xb] == '\0' &&
                      (((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[0xc] == '\0'
                       && ((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[0xd] ==
                           '\0')))))) &&
                    ((a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[0xe] == '\0'))))
                {
                  bVar12 = (a->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr8[0xf] ==
                           '\x01';
                  goto LAB_002c151d;
                }
LAB_002c152b:
                bVar12 = is_link_local(&a->interface_address);
                bVar9 = 6;
                if ((!bVar12) && (((a->flags).m_val & 4) == 0)) {
                  bVar12 = is_global(&a->interface_address);
                  bVar9 = 4;
                  if ((!bVar12) &&
                     ((((a->flags).m_val & 8) == 0 &&
                      (routes_01.m_len = extraout_RDX, routes_01.m_ptr = local_80,
                      bVar12 = has_any_internet_route((aux *)local_88,routes_01), bVar12)))) {
                    sVar4 = strlen(a->name);
                    iVar3 = family(&a->interface_address);
                    routes_00.m_len = (difference_type)local_80;
                    routes_00.m_ptr = local_88;
                    device._M_str = a->name;
                    device._M_len = sVar4;
                    bVar12 = has_internet_route(device,iVar3,routes_00);
                    bVar9 = !bVar12 * '\x02' | 4;
                  }
                }
              }
              local_a0._M_pred.ipface =
                   (ip_interface *)
                   CONCAT71(local_a0._M_pred.ipface._1_7_,bVar9 | (plVar5->flags).m_val);
              ::std::
              vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
              ::
              emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string_const&,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>>
                        (local_90,&a->interface_address,local_58,local_68,local_60,
                         (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                          *)&local_a0);
            }
          }
          a = a + 1;
        } while (a != piVar7);
      }
      plVar5 = plVar5 + 1;
    } while (plVar5 != local_50);
  }
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>::
  ~vector(&local_48);
  return;
}

Assistant:

void expand_unspecified_address(span<ip_interface const> const ifs
		, span<ip_route const> const routes
		, std::vector<listen_endpoint_t>& eps)
	{
		auto unspecified_begin = std::partition(eps.begin(), eps.end()
			, [](listen_endpoint_t const& ep) { return !ep.addr.is_unspecified(); });
		std::vector<listen_endpoint_t> unspecified_eps(unspecified_begin, eps.end());
		eps.erase(unspecified_begin, eps.end());
		for (auto const& uep : unspecified_eps)
		{
			bool const v4 = uep.addr.is_v4();
			for (auto const& ipface : ifs)
			{
				if (!ipface.preferred)
					continue;
				if (ipface.interface_address.is_v4() != v4)
					continue;
				if (!uep.device.empty() && uep.device != ipface.name)
					continue;
				if (std::any_of(eps.begin(), eps.end(), [&](listen_endpoint_t const& e)
				{
					// ignore device name because we don't want to create
					// duplicates if the user explicitly configured an address
					// without a device name
					return e.addr == ipface.interface_address
						&& e.port == uep.port
						&& e.ssl == uep.ssl;
				}))
				{
					continue;
				}

				// ignore interfaces that are down
				if (ipface.state != if_state::up && ipface.state != if_state::unknown)
					continue;
				if (!(ipface.flags & if_flags::up))
					continue;

				// we assume this listen_socket_t is local-network under some
				// conditions, meaning we won't announce it to internet trackers
				// if "routes" does not contain a single route to the internet,
				// we don't use the last case. On MacOS, we can be notified of
				// network changes *before* the routing table is updated
				bool const local
					= ipface.interface_address.is_loopback()
					|| is_link_local(ipface.interface_address)
					|| (ipface.flags & if_flags::loopback)
					|| (!is_global(ipface.interface_address)
						&& !(ipface.flags & if_flags::pointopoint)
						&& has_any_internet_route(routes)
						&& !has_internet_route(ipface.name, family(ipface.interface_address), routes));

				eps.emplace_back(ipface.interface_address, uep.port, uep.device
					, uep.ssl, uep.flags | listen_socket_t::was_expanded
					| (local ? listen_socket_t::local_network : listen_socket_flags_t{}));
			}
		}
	}